

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rational.cpp
# Opt level: O2

void anon_unknown.dwarf_7f585::test_copy_construction<unsigned_long>(void)

{
  value_type_conflict7 vVar1;
  value_type_conflict7 vVar2;
  ResultBuilder *pRVar3;
  value_type_conflict7 local_310;
  value_type_conflict7 local_308;
  SourceLineInfo local_300;
  rational r1;
  ResultBuilder __catchResult;
  
  r1.num_ = 3;
  r1.denom_ = 2;
  tcb::rational<unsigned_long>::simplify(&r1);
  vVar2 = r1.denom_;
  vVar1 = r1.num_;
  Catch::SourceLineInfo::SourceLineInfo
            (&local_300,
             "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
             ,0x4b);
  Catch::ResultBuilder::ResultBuilder
            (&__catchResult,"REQUIRE",&local_300,"r2.num() == r1.num()",Normal,"");
  std::__cxx11::string::~string((string *)&local_300);
  local_308 = vVar1;
  local_310 = r1.num_;
  local_300.file._M_dataplus._M_p = (pointer)&__catchResult;
  local_300.file._M_string_length = (size_type)&local_308;
  pRVar3 = Catch::ExpressionLhs<unsigned_long_const&>::
           captureExpression<(Catch::Internal::Operator)0,unsigned_long>
                     ((ExpressionLhs<unsigned_long_const&> *)&local_300,&local_310);
  Catch::ResultBuilder::endExpression(pRVar3);
  Catch::ResultBuilder::shouldDebugBreak(&__catchResult);
  Catch::ResultBuilder::react(&__catchResult);
  Catch::ResultBuilder::~ResultBuilder(&__catchResult);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_300,
             "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
             ,0x4c);
  Catch::ResultBuilder::ResultBuilder
            (&__catchResult,"REQUIRE",&local_300,"r2.denom() == r1.denom()",Normal,"");
  std::__cxx11::string::~string((string *)&local_300);
  local_308 = vVar2;
  local_310 = r1.denom_;
  local_300.file._M_dataplus._M_p = (pointer)&__catchResult;
  local_300.file._M_string_length = (size_type)&local_308;
  pRVar3 = Catch::ExpressionLhs<unsigned_long_const&>::
           captureExpression<(Catch::Internal::Operator)0,unsigned_long>
                     ((ExpressionLhs<unsigned_long_const&> *)&local_300,&local_310);
  Catch::ResultBuilder::endExpression(pRVar3);
  Catch::ResultBuilder::shouldDebugBreak(&__catchResult);
  Catch::ResultBuilder::react(&__catchResult);
  Catch::ResultBuilder::~ResultBuilder(&__catchResult);
  return;
}

Assistant:

void test_copy_construction()
{
    using rational = tcb::rational<T>;
    
#ifdef TCB_HAVE_CONSTEXPR14
	{
		constexpr rational r1{3, 2};
        constexpr rational r2{r1};
        static_assert(r2.num() == r1.num(), "");
        static_assert(r2.denom() == r1.denom(), "");
    }
#endif

    {
		const rational r1{3, 2};
        const rational r2{r1};
        REQUIRE(r2.num() == r1.num());
        REQUIRE(r2.denom() == r1.denom());
    }
}